

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O3

void mon_catchup_elapsed_time(monst *mtmp,long nmv)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uchar uVar5;
  int iVar6;
  int iVar7;
  char cVar8;
  long lVar10;
  int iVar9;
  
  lVar10 = 0x7ffe;
  if (nmv < 0x7ffe) {
    lVar10 = nmv;
  }
  bVar1 = mtmp->mblinded;
  cVar8 = (char)lVar10;
  iVar9 = (int)lVar10;
  if (bVar1 != 0) {
    uVar5 = '\x01';
    if (iVar9 < (int)(uint)bVar1) {
      uVar5 = bVar1 - cVar8;
    }
    mtmp->mblinded = uVar5;
  }
  bVar1 = mtmp->mfrozen;
  if (bVar1 != 0) {
    uVar5 = '\x01';
    if (iVar9 < (int)(uint)bVar1) {
      uVar5 = bVar1 - cVar8;
    }
    mtmp->mfrozen = uVar5;
  }
  bVar1 = mtmp->mfleetim;
  if (bVar1 != 0) {
    uVar5 = '\x01';
    if (iVar9 < (int)(uint)bVar1) {
      uVar5 = bVar1 - cVar8;
    }
    mtmp->mfleetim = uVar5;
  }
  uVar4 = *(uint *)&mtmp->field_0x60;
  if ((uVar4 >> 0x17 & 1) != 0) {
    uVar3 = mt_random();
    uVar4 = *(uint *)&mtmp->field_0x60;
    if (0x14 < SUB164(ZEXT416(uVar3) % SEXT816((lVar10 << 0x20) + 0x100000000 >> 0x20),0)) {
      uVar4 = uVar4 & 0xff7fffff;
      *(uint *)&mtmp->field_0x60 = uVar4;
    }
  }
  if ((uVar4 >> 0x15 & 1) != 0) {
    uVar3 = mt_random();
    uVar4 = *(uint *)&mtmp->field_0x60;
    if (0x19 < SUB164(ZEXT416(uVar3) % SEXT816((lVar10 << 0x20) + 0x100000000 >> 0x20),0)) {
      uVar4 = uVar4 & 0xffdfffff;
      *(uint *)&mtmp->field_0x60 = uVar4;
    }
  }
  if (((uVar4 >> 0x14 & 1) != 0) &&
     (uVar4 = mt_random(),
     5 < SUB164(ZEXT416(uVar4) % SEXT816((lVar10 << 0x20) + 0x100000000 >> 0x20),0))) {
    mtmp->field_0x62 = mtmp->field_0x62 & 0xef;
  }
  iVar6 = mtmp->meating - iVar9;
  if (mtmp->meating < iVar9) {
    iVar6 = 0;
  }
  iVar7 = mtmp->mspec_used - iVar9;
  if (mtmp->mspec_used < iVar9) {
    iVar7 = 0;
  }
  mtmp->meating = iVar6;
  mtmp->mspec_used = iVar7;
  cVar8 = mtmp->mtame;
  if (cVar8 != '\0') {
    iVar6 = (iVar9 + 0x4b) / 0x96;
    if (iVar6 < cVar8) {
      cVar2 = cVar8 - (char)iVar6;
      mtmp->mtame = cVar2;
      if (cVar2 != '\0') {
        if (((*(uint *)&mtmp->field_0x60 >> 0x1a & 1) == 0) &&
           ((mtmp->data->mflags1 & 0x60000000) != 0)) {
          iVar7 = *(int *)((long)&mtmp[1].data + 4);
          uVar4 = iVar7 + 0x2ee;
          if (iVar7 + 500U < moves) {
            if ((uVar4 < moves) || (mtmp->mhp < 3)) {
LAB_0017294f:
              uVar4 = *(uint *)&mtmp->field_0x60 & 0xfbbfffff;
              goto LAB_001728e5;
            }
          }
          else if (uVar4 < moves) goto LAB_0017294f;
        }
        if (cVar8 != (char)iVar6) goto LAB_0017290a;
      }
    }
    else {
      uVar4 = mt_random();
      if ((int)cVar8 <= SUB164(ZEXT416(uVar4) % SEXT816((long)iVar6),0)) {
        uVar4 = *(uint *)&mtmp->field_0x60 & 0xffbfffff;
LAB_001728e5:
        *(uint *)&mtmp->field_0x60 = uVar4;
      }
      mtmp->mtame = '\0';
    }
  }
  if ((mtmp->field_0x63 & 1) != 0) {
    impossible("catching up for leashed monster?");
    m_unleash(mtmp,'\0');
  }
LAB_0017290a:
  iVar6 = iVar9 / 0x14;
  if ((mtmp->data->mflags1 >> 0x17 & 1) != 0) {
    iVar6 = iVar9;
  }
  iVar6 = iVar6 + mtmp->mhp;
  if (mtmp->mhpmax <= iVar6) {
    iVar6 = mtmp->mhpmax;
  }
  mtmp->mhp = iVar6;
  return;
}

Assistant:

void mon_catchup_elapsed_time(struct monst *mtmp, long nmv)
{
	int imv = 0;	/* avoid zillions of casts and lint warnings */

	if (nmv >= LARGEST_INT)		/* paranoia */
	    imv = LARGEST_INT - 1;
	else
	    imv = (int)nmv;

	/* might stop being afraid, blind or frozen */
	/* set to 1 and allow final decrement in movemon() */
	if (mtmp->mblinded) {
	    if (imv >= (int) mtmp->mblinded) mtmp->mblinded = 1;
	    else mtmp->mblinded -= imv;
	}
	if (mtmp->mfrozen) {
	    if (imv >= (int) mtmp->mfrozen) mtmp->mfrozen = 1;
	    else mtmp->mfrozen -= imv;
	}
	if (mtmp->mfleetim) {
	    if (imv >= (int) mtmp->mfleetim) mtmp->mfleetim = 1;
	    else mtmp->mfleetim -= imv;
	}

	/* might recover from temporary trouble */
	if (mtmp->mtrapped && rn2(imv + 1) > 40/2) mtmp->mtrapped = 0;
	if (mtmp->mconf    && rn2(imv + 1) > 50/2) mtmp->mconf = 0;
	if (mtmp->mstun    && rn2(imv + 1) > 10/2) mtmp->mstun = 0;

	/* might finish eating or be able to use special ability again */
	if (imv > mtmp->meating) mtmp->meating = 0;
	else mtmp->meating -= imv;
	if (imv > mtmp->mspec_used) mtmp->mspec_used = 0;
	else mtmp->mspec_used -= imv;

	/* reduce tameness for every 150 moves you are separated */
	if (mtmp->mtame) {
	    int wilder = (imv + 75) / 150;
	    if (mtmp->mtame > wilder) mtmp->mtame -= wilder;	/* less tame */
	    else if (mtmp->mtame > rn2(wilder)) mtmp->mtame = 0;  /* untame */
	    else mtmp->mtame = mtmp->mpeaceful = 0;		/* hostile! */
	}
	/* check to see if it would have died as a pet; if so, go wild instead
	 * of dying the next time we call dog_move()
	 */
	if (mtmp->mtame && !mtmp->isminion &&
			(carnivorous(mtmp->data) || herbivorous(mtmp->data))) {
	    struct edog *edog = EDOG(mtmp);

	    if ((moves > edog->hungrytime + 500 && mtmp->mhp < 3) ||
		    (moves > edog->hungrytime + 750))
		mtmp->mtame = mtmp->mpeaceful = 0;
	}

	if (!mtmp->mtame && mtmp->mleashed) {
	    /* leashed monsters should always be with hero, consequently
	       never losing any time to be accounted for later */
	    impossible("catching up for leashed monster?");
	    m_unleash(mtmp, FALSE);
	}

	/* recover lost hit points */
	if (!regenerates(mtmp->data)) imv /= 20;
	if (mtmp->mhp + imv >= mtmp->mhpmax)
	    mtmp->mhp = mtmp->mhpmax;
	else mtmp->mhp += imv;
}